

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int buffsave(buffer *bp)

{
  mgwin *pmVar1;
  mgwin *pmVar2;
  int iVar3;
  FILE *local_28;
  FILE *ffp;
  
  if ((bp->b_flag & 1U) == 0) {
    ewprintf("(No changes need to be saved)");
    iVar3 = 1;
  }
  else if (bp->b_fname[0] == '\0') {
    dobeep();
    iVar3 = 0;
    ewprintf("No file name");
  }
  else {
    iVar3 = fchecktime(bp);
    if ((iVar3 == 1) ||
       (iVar3 = eyesno("File has changed on disk since last save. Save anyway"), iVar3 == 1)) {
      if ((makebackup != 0) && ((bp->b_flag & 2U) != 0)) {
        iVar3 = fbackupfile(bp->b_fname);
        if (iVar3 == 2) {
          return 0;
        }
        if ((iVar3 == 0) && (iVar3 = eyesno("Backup error, save anyway"), iVar3 != 1)) {
          return iVar3;
        }
      }
      iVar3 = writeout(&local_28,bp,bp->b_fname);
      if (iVar3 == 1) {
        fupdstat(bp);
        bp->b_flag = bp->b_flag & 0xfc;
        pmVar2 = curwp;
        for (pmVar1 = wheadp; pmVar1 != (mgwin *)0x0; pmVar1 = (pmVar1->w_list).l_p.l_wp) {
          if ((bp == (buffer *)0x0) || (pmVar2->w_bufp == bp)) {
            pmVar1->w_rflag = pmVar1->w_rflag | 0x10;
          }
        }
        undo_add_boundary(8,1);
        undo_add_modified();
      }
    }
  }
  return iVar3;
}

Assistant:

int
buffsave(struct buffer *bp)
{
	int	 s;
        FILE    *ffp;

	/* return, no changes */
	if ((bp->b_flag & BFCHG) == 0) {
		ewprintf("(No changes need to be saved)");
		return (TRUE);
	}

	/* must have a name */
	if (bp->b_fname[0] == '\0') {
		dobeep();
		ewprintf("No file name");
		return (FALSE);
	}

	/* Ensure file has not been modified elsewhere */
	/* We don't use the ignore flag here */
	if (fchecktime(bp) != TRUE) {
		if ((s = eyesno("File has changed on disk since last save. "
		    "Save anyway")) != TRUE)
			return (s);
	}
	
	if (makebackup && (bp->b_flag & BFBAK)) {
		s = fbackupfile(bp->b_fname);
		/* hard error */
		if (s == ABORT)
			return (FALSE);
		/* softer error */
		if (s == FALSE &&
		    (s = eyesno("Backup error, save anyway")) != TRUE)
			return (s);
	}
	if ((s = writeout(&ffp, bp, bp->b_fname)) == TRUE) {
		(void)fupdstat(bp);
		bp->b_flag &= ~(BFCHG | BFBAK);
		upmodes(bp);
		undo_add_boundary(FFRAND, 1);
		undo_add_modified();
	}
	return (s);
}